

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

edata_t * duckdb_je_base_alloc_edata(tsdn_t *tsdn,base_t *base)

{
  edata_t *peVar1;
  size_t usize;
  size_t esn;
  size_t local_18;
  uint local_10 [2];
  
  peVar1 = (edata_t *)base_alloc_impl(tsdn,base,0x80,0x80,(size_t *)local_10,&local_18);
  if (peVar1 == (edata_t *)0x0) {
    peVar1 = (edata_t *)0x0;
  }
  else {
    base->edata_allocated = base->edata_allocated + local_18;
    (peVar1->field_2).e_size_esn =
         (ulong)(local_10[0] & 0xfff) | (peVar1->field_2).e_size_esn & 0xfffffffffffff000;
  }
  return peVar1;
}

Assistant:

edata_t *
base_alloc_edata(tsdn_t *tsdn, base_t *base) {
	size_t esn, usize;
	edata_t *edata = base_alloc_impl(tsdn, base, sizeof(edata_t),
	    EDATA_ALIGNMENT, &esn, &usize);
	if (edata == NULL) {
		return NULL;
	}
	if (config_stats) {
		base->edata_allocated += usize;
	}
	edata_esn_set(edata, esn);
	return edata;
}